

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O2

_Bool effect_handler_DELVING(effect_handler_context_t_conflict *context)

{
  loc finish;
  _Bool _Var1;
  source sVar2;
  source origin;
  loc grid;
  
  grid = (loc)loc(0,0);
  target_get((loc_conflict *)&grid);
  context->ident = true;
  _Var1 = loc_eq((loc_conflict)grid,player->grid);
  if (_Var1) {
    sVar2._4_4_ = 0;
    sVar2.what = (context->origin).what;
    finish.x = (player->grid).x;
    finish.y = (player->grid).y;
    sVar2.which.trap = (context->origin).which.trap;
    project(sVar2,L'\x04',finish,L'Ĭ',L'\x1e',L't',L'\0','\x02',(object *)0x0);
  }
  else {
    sVar2 = source_player();
    origin.which = sVar2.which;
    origin._4_4_ = 0;
    origin.what = sVar2.what;
    effect_simple(L'\\',origin,"160 + d240",L'\x1e',L'\0',L'\0',L'\0',L'\0',(_Bool *)0x0);
  }
  return true;
}

Assistant:

bool effect_handler_DELVING(effect_handler_context_t *context)
{
	struct loc grid = loc(0, 0);
	int flg = PROJECT_GRID | PROJECT_ITEM | PROJECT_KILL | PROJECT_THRU;
	target_get(&grid);

	context->ident = true;

	/* Aimed at oneself, this rod creates a room. */
	if (loc_eq(grid, player->grid)) {
		/* Lots of damage to creatures of stone. */
		(void) project(context->origin, 4, player->grid, 300, PROJ_KILL_WALL,
					   flg, 0, 2, NULL);
	} else {
		/* Otherwise, an extremely powerful destroy wall/stone. */
		effect_simple(EF_LINE, source_player(), "160 + d240", PROJ_KILL_WALL, 0,
					  0, 0, 0, NULL);
	}
	return true;
}